

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int naBaseCategory(atom *a)

{
  char *pcVar1;
  int iVar2;
  char *__needle;
  int *piVar3;
  
  if ((~a->props & 0x2002U) == 0) {
    __needle = a->r->resname;
    pcVar1 = strstr(":  C:  G:  A:  T:  U:CYT:GUA:ADE:THY:URA:CTP:CDP:CMP:GTP:GDP:GMP:ATP:ADP:AMP:TTP:TDP:TMP:UTP:UDP:UMP:GSP:H2U:PSU:1MG:2MG:M2G:7MG:5MC:5MU:T6A:1MA:RIA:OMC:OMG: YG:  I: DA: DT: DC: DG: DI: AR: UR: TR: GR: CR:"
                    ,__needle);
    iVar2 = 0x70;
    if (pcVar1 != (char *)0x0) {
      for (piVar3 = &NAbaseGrouping[0].bits;
          ((ResidueAndAtomPair *)(piVar3 + -4))->rlist != (char *)0x0; piVar3 = piVar3 + 6) {
        pcVar1 = strstr(((ResidueAndAtomPair *)(piVar3 + -4))->rlist,__needle);
        if (pcVar1 != (char *)0x0) {
          return *piVar3;
        }
      }
    }
  }
  else {
    iVar2 = 0x71;
  }
  return iVar2;
}

Assistant:

int naBaseCategory(atom *a) {
   ResidueAndAtomPair *pair;

   if ((a->props & DNA_PROP) && (a->props & SC_PROP)) {
      if(strstr(NAList, a->r->resname)) {
         for (pair = NAbaseGrouping; pair->rlist; pair++){
	    if(strstr(pair->rlist, a->r->resname)) {
	       return pair->bits; /* bits contain the atom type */
	    }
         }
         return baseOther; /* not in table */
      }
     else return baseOther; /* not in list */
   }
   else return nonBase; /* backbone or not recognized as a nucleic acid */
}